

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O2

FModelVertex * __thiscall FModelVertexBuffer::LockVertexBuffer(FModelVertexBuffer *this,uint size)

{
  GLuint GVar1;
  FModelVertex *pFVar2;
  long lVar3;
  ulong __n;
  
  GVar1 = (this->super_FVertexBuffer).vbo_id;
  if (GVar1 == 0) {
    if (this->vbo_ptr != (FModelVertex *)0x0) {
      operator_delete__(this->vbo_ptr);
    }
    __n = (ulong)size * 0x14;
    pFVar2 = (FModelVertex *)operator_new__(__n);
    this->vbo_ptr = pFVar2;
    pFVar2 = (FModelVertex *)memset(pFVar2,0,__n);
    return pFVar2;
  }
  (*_ptrc_glBindBuffer)(0x8892,GVar1);
  lVar3 = (ulong)size * 0x14;
  (*_ptrc_glBufferData)(0x8892,lVar3,(void *)0x0,0x88e4);
  if (gl.legacyMode != false) {
    pFVar2 = (FModelVertex *)(*_ptrc_glMapBuffer)(0x8892,0x88b9);
    return pFVar2;
  }
  pFVar2 = (FModelVertex *)(*_ptrc_glMapBufferRange)(0x8892,0,lVar3,10);
  return pFVar2;
}

Assistant:

FModelVertex *FModelVertexBuffer::LockVertexBuffer(unsigned int size)
{
	if (vbo_id > 0)
	{
		glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
		glBufferData(GL_ARRAY_BUFFER, size * sizeof(FModelVertex), nullptr, GL_STATIC_DRAW);
		if (!gl.legacyMode)
			return (FModelVertex*)glMapBufferRange(GL_ARRAY_BUFFER, 0, size * sizeof(FModelVertex), GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT);
		else
			return (FModelVertex*)glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY);
	}
	else
	{
		if (vbo_ptr != nullptr) delete[] vbo_ptr;
		vbo_ptr = new FModelVertex[size];
		memset(vbo_ptr, 0, size * sizeof(FModelVertex));
		return vbo_ptr;
	}
}